

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O1

BOOL __thiscall
Js::DynamicObject::SetObjectArrayItemWritable
          (DynamicObject *this,PropertyId propertyId,BOOL writable)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = HasObjectArray(this);
  if (bVar1) {
    iVar2 = (**(code **)(**(long **)&(this->field_1).field_1 + 0x1d8))
                      (*(long **)&(this->field_1).field_1,propertyId,writable);
    bVar1 = iVar2 != 0;
  }
  else {
    bVar1 = false;
  }
  if ((writable == 0) && (bVar1 != false)) {
    InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype(this);
  }
  return (BOOL)bVar1;
}

Assistant:

BOOL DynamicObject::SetObjectArrayItemWritable(PropertyId propertyId, BOOL writable)
    {
        const auto result = HasObjectArray() && GetObjectArrayOrFlagsAsArray()->SetWritable(propertyId, writable);
        if (!writable && result)
        {
            InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype();
        }
        return result;
    }